

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

bool __thiscall test_case::eval_perf(test_case *this,ggml_backend_t backend,char *op_name)

{
  _Alloc_hider _Var1;
  test_case *ptVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 extraout_var_00;
  ulong uVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ggml_tensor *t;
  size_t sVar12;
  long lVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int iVar14;
  ulong uVar15;
  ulong extraout_RDX;
  FILE *__stream;
  int i;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_class_1_0_00000001 format_flops;
  anon_class_1_0_00000001 tensor_op_size;
  ggml_context_ptr ctx;
  long local_a8;
  ggml_backend_buffer_ptr buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long local_78;
  test_case *local_70;
  long local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined7 uStack_57;
  string local_50;
  undefined4 extraout_var_01;
  
  this->mode = MODE_PERF;
  lVar7 = ggml_tensor_overhead();
  lVar8 = ggml_graph_overhead_custom(0x2000,0);
  lVar8 = lVar8 + lVar7 * 0x80;
  uStack_60 = 0;
  local_58 = 1;
  uVar9 = CONCAT71(uStack_57,1);
  uVar10 = 0;
  local_68 = lVar8;
  ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)ggml_init();
  if ((tuple<ggml_context_*,_ggml_context_deleter>)
      ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ggml_context_*,_false>)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
               ,0x25f,"GGML_ASSERT(%s) failed","ctx",in_R8,in_R9,lVar8,uVar10,uVar9);
  }
  iVar5 = (*this->_vptr_test_case[4])
                    (this,ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
  lVar7 = CONCAT44(extraout_var,iVar5);
  if (op_name != (char *)0x0) {
    (*this->_vptr_test_case[2])(&local_98,this,lVar7);
    bVar3 = std::operator!=(&local_98,op_name);
    std::__cxx11::string::~string((string *)&local_98);
    bVar19 = true;
    if (bVar3) goto LAB_00132893;
  }
  (*this->_vptr_test_case[2])(&local_98,this,lVar7);
  _Var1._M_p = local_98._M_dataplus._M_p;
  (*this->_vptr_test_case[3])(&local_50,this);
  iVar5 = printf("  %s(%s): ",_Var1._M_p,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  fflush(_stdout);
  cVar4 = ggml_backend_supports_op(backend,lVar7);
  if (cVar4 == '\0') {
    puts("not supported");
    bVar19 = true;
  }
  else {
    iVar6 = (iVar5 + 7) / 8;
    iVar14 = iVar6 * 8;
    iVar6 = iVar6 * 8 + 8;
    if (4 < iVar14 - iVar5) {
      iVar6 = iVar14;
    }
    printf("%*s",(ulong)(uint)(iVar6 - iVar5),"");
    buf._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
    super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
    super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl =
         (__uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>)
         ggml_backend_alloc_ctx_tensors
                   (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,backend);
    if ((tuple<ggml_backend_buffer_*,_ggml_backend_buffer_deleter>)
        buf._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
        super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
        super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl ==
        (_Head_base<0UL,_ggml_backend_buffer_*,_false>)0x0) {
      puts("failed to allocate tensors");
      bVar19 = false;
    }
    else {
      (*this->_vptr_test_case[0xb])
                (this,ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      uVar9 = ggml_new_graph_custom
                        (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0x2000,0);
      ggml_build_forward_expand(uVar9,lVar7);
      iVar5 = ggml_backend_graph_compute(backend,uVar9);
      __stream = _stderr;
      if (iVar5 == 0) {
        uVar10 = ggml_backend_get_device(backend);
        iVar5 = ggml_backend_dev_type(uVar10);
        iVar6 = (*this->_vptr_test_case[0xd])(this,lVar7);
        if (CONCAT44(extraout_var_00,iVar6) == 0) {
          uVar18 = 0x800000000;
          if (iVar5 == 0) {
            uVar18 = 0x200000000;
          }
          iVar5 = ggml_graph_size(uVar9);
          iVar6 = ggml_graph_n_nodes(uVar9);
          iVar14 = (*this->_vptr_test_case[0xc])(this,lVar7);
          uVar11 = CONCAT44(extraout_var_02,iVar14);
        }
        else {
          uVar18 = 100000000000;
          if (iVar5 == 0) {
            uVar18 = 8000000000;
          }
          iVar5 = ggml_graph_size(uVar9);
          iVar6 = ggml_graph_n_nodes(uVar9);
          iVar14 = (*this->_vptr_test_case[0xd])(this,lVar7);
          uVar11 = CONCAT44(extraout_var_01,iVar14);
        }
        uVar15 = uVar18 % uVar11;
        iVar14 = (int)(uVar18 / uVar11);
        if (iVar5 - iVar6 < iVar14) {
          iVar14 = iVar5 - iVar6;
        }
        iVar5 = 0;
        if (0 < iVar14) {
          iVar5 = iVar14;
        }
        while (bVar3 = iVar5 != 0, iVar5 = iVar5 + -1, bVar3) {
          ggml_graph_add_node(uVar9,lVar7);
          uVar15 = extraout_RDX;
        }
        iVar5 = (*this->_vptr_test_case[0xc])(this,lVar7,uVar15);
        local_a8 = CONCAT44(extraout_var_03,iVar5) * (long)(iVar14 + 1);
        iVar5 = 0;
        while( true ) {
          iVar6 = ggml_graph_n_nodes(uVar9);
          if (iVar6 <= iVar5) break;
          lVar8 = ggml_graph_node(uVar9,iVar5);
          if (3 < *(int *)(lVar8 + 0x50) - 0x22U) {
            lVar8 = ggml_graph_node(uVar9,iVar5);
            if (lVar8 != lVar7) {
              t = (ggml_tensor *)ggml_graph_node(uVar9,iVar5);
              sVar12 = eval_perf::anon_class_1_0_00000001::operator()(&tensor_op_size,t);
              local_a8 = local_a8 + sVar12;
            }
          }
          iVar5 = iVar5 + 1;
        }
        lVar8 = 0;
        lVar16 = 0;
        uVar17 = 0;
        local_78 = lVar7;
        local_70 = this;
        do {
          lVar7 = ggml_time_us();
          iVar5 = ggml_backend_graph_compute(backend,uVar9);
          __stream = _stderr;
          bVar19 = iVar5 == 0;
          if (!bVar19) {
            uVar9 = ggml_status_to_string(iVar5);
            goto LAB_001328f3;
          }
          lVar13 = ggml_time_us();
          lVar8 = lVar8 + (lVar13 - lVar7);
          lVar16 = lVar16 + local_a8;
          uVar17 = uVar17 + iVar14 + 1;
        } while (lVar8 < 1000000);
        dVar20 = (double)lVar8;
        printf("    %8d runs - %8.2f us/run - ",dVar20 / (double)(int)uVar17,(ulong)uVar17);
        ptVar2 = local_70;
        lVar7 = local_78;
        iVar5 = (*local_70->_vptr_test_case[0xd])(local_70,local_78);
        if (CONCAT44(extraout_var_04,iVar5) == 0) {
          iVar5 = (*ptVar2->_vptr_test_case[0xc])(ptVar2,lVar7);
          printf("%8zu kB/run - \x1b[1;34m%7.2f GB/s\x1b[0m",
                 ((double)lVar16 / (dVar20 / 1000000.0)) * 0.0009765625 * 0.0009765625 *
                 0.0009765625,CONCAT44(extraout_var_07,iVar5) >> 10);
        }
        else {
          iVar5 = (*ptVar2->_vptr_test_case[0xd])(ptVar2,lVar7);
          iVar6 = (*ptVar2->_vptr_test_case[0xd])(ptVar2,lVar7);
          auVar21._4_4_ = extraout_var_06;
          auVar21._0_4_ = iVar6;
          auVar21._8_4_ = extraout_var_06;
          auVar21._12_4_ = 0x45300000;
          eval_perf(ggml_backend*,char_const*)::{lambda(double)#1}::operator()[abi_cxx11_
                    (&local_98,&format_flops,
                     (auVar21._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0));
          lVar7 = CONCAT44(extraout_var_05,iVar5) * (long)(int)uVar17;
          auVar22._8_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar22._0_8_ = lVar7;
          auVar22._12_4_ = 0x45300000;
          eval_perf(ggml_backend*,char_const*)::{lambda(double)#1}::operator()[abi_cxx11_
                    (&local_50,&format_flops,
                     ((auVar22._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                     (dVar20 / 1000000.0));
          printf("%s/run - \x1b[1;34m%sS\x1b[0m",local_98._M_dataplus._M_p,local_50._M_dataplus._M_p
                );
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_98);
        }
        putchar(10);
      }
      else {
        uVar9 = ggml_status_to_string(iVar5);
        bVar19 = false;
LAB_001328f3:
        fprintf(__stream,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_perf",uVar9);
      }
    }
    std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr(&buf);
  }
LAB_00132893:
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&ctx);
  return bVar19;
}

Assistant:

bool eval_perf(ggml_backend_t backend, const char * op_name) {
        mode = MODE_PERF;

        static const size_t graph_nodes = 8192;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead_custom(graph_nodes, false),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        ggml_tensor * out = build_graph(ctx.get());

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        int len = printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if backends support op
        if (!ggml_backend_supports_op(backend, out)) {
            printf("not supported\n");
            return true;
        }

        // align while also leaving some margin for variations in parameters
        int align = 8;
        int last = (len + align - 1) / align * align;
        if (last - len < 5) {
            last += align;
        }
        printf("%*s", last - len, "");

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr

        if (buf == NULL) {
            printf("failed to allocate tensors\n");
            return false;
        }

        // randomize tensors
        initialize_tensors(ctx.get());

        // build graph
        ggml_cgraph * gf = ggml_new_graph_custom(ctx.get(), graph_nodes, false);
        ggml_build_forward_expand(gf, out);

        // warmup run
        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        // determine number of runs
        int n_runs;
        bool is_cpu = ggml_backend_dev_type(ggml_backend_get_device(backend)) == GGML_BACKEND_DEVICE_TYPE_CPU;
        if (op_flops(out) > 0) {
            // based on flops
            const uint64_t GFLOP = 1000 * 1000 * 1000;
            const uint64_t target_flops_cpu =   8ULL * GFLOP;
            const uint64_t target_flops_gpu = 100ULL * GFLOP;
            uint64_t target_flops = is_cpu ? target_flops_cpu : target_flops_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_flops / op_flops(out)) + 1;
        } else {
            // based on memory size
            const size_t GB = 1ULL << 30;
            const size_t target_size_cpu =  8 * GB;
            const size_t target_size_gpu = 32 * GB;
            size_t target_size = is_cpu ? target_size_cpu : target_size_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_size / op_size(out)) + 1;
        }

        // duplicate the op
        for (int i = 1; i < n_runs; i++) {
            ggml_graph_add_node(gf, out);
        }

        // calculate memory
        size_t mem = n_runs * op_size(out);
        auto tensor_op_size = [](ggml_tensor * t) {
            size_t size = ggml_nbytes(t);
            // add source tensors
            for (int i = 0; i < GGML_MAX_SRC; i++) {
                if (t->src[i] != NULL) {
                    size += ggml_nbytes(t->src[i]);
                }
            }
            return size;
        };
        for (int i = 0; i < ggml_graph_n_nodes(gf); ++i) {
            if (ggml_is_view_op(ggml_graph_node(gf, i)->op) || ggml_graph_node(gf, i) == out) {
                continue;
            }
            mem += tensor_op_size(ggml_graph_node(gf, i));
        }

        // run
        int64_t total_time_us = 0;
        int64_t total_mem = 0;
        int total_runs = 0;
        do {
            int64_t start_time = ggml_time_us();
            ggml_status status = ggml_backend_graph_compute(backend, gf);
            if (status != GGML_STATUS_SUCCESS) {
                fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                return false;
            }
            int64_t end_time = ggml_time_us();

            total_time_us += end_time - start_time;
            total_mem += mem;
            total_runs += n_runs;
        } while (total_time_us < 1000*1000); // run for at least 1 second

        printf("    %8d runs - %8.2f us/run - ",
            total_runs,
            (double)total_time_us / total_runs);

        if (op_flops(out) > 0) {
            double flops_per_sec = (op_flops(out) * total_runs) / (total_time_us / 1e6);
            auto format_flops = [](double flops) -> std::string {
                char buf[256];
                if (flops >= 1e12) {
                    snprintf(buf, sizeof(buf), "%6.2f TFLOP", flops / 1e12);
                } else if (flops >= 1e9) {
                    snprintf(buf, sizeof(buf), "%6.2f GFLOP", flops / 1e9);
                } else if (flops >= 1e6) {
                    snprintf(buf, sizeof(buf), "%6.2f MFLOP", flops / 1e6);
                } else {
                    snprintf(buf, sizeof(buf), "%6.2f KFLOP", flops / 1e3);
                }
                return buf;
            };
            printf("%s/run - \033[1;34m%sS\033[0m",
                format_flops(op_flops(out)).c_str(),
                format_flops(flops_per_sec).c_str());

        } else {
            printf("%8zu kB/run - \033[1;34m%7.2f GB/s\033[0m",
                op_size(out) / 1024,
                total_mem / (total_time_us / 1e6) / 1024.0 / 1024.0 / 1024.0);
        }
        printf("\n");

        return true;
    }